

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week14-app2.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  allocator_type aVar1;
  int *piVar2;
  pointer piVar3;
  pointer piVar4;
  undefined8 uVar5;
  pointer pcVar6;
  uint uVar7;
  ostream *poVar8;
  allocator_type *paVar9;
  long *plVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> tmp;
  allocator_type *paVar12;
  vector<char,_std::allocator<char>_> *pvVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  char *b;
  int iVar18;
  ulong uVar19;
  int iVar20;
  pointer pdVar21;
  allocator_type *paVar22;
  bool bVar23;
  initializer_list<double> __l;
  initializer_list<char> __l_00;
  initializer_list<short> __l_01;
  initializer_list<int> __l_02;
  facade_iterator_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
  __begin1;
  vector<double> v1;
  vector<short> v;
  vector<char> v2;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  undefined1 local_90 [16];
  pointer local_80;
  vector<short,_std::allocator<short>_> local_78;
  vector<double,_std::allocator<double>_> *pvStack_60;
  double local_58;
  vector<char,_std::allocator<char>_> local_50;
  ulong local_38;
  
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4025000000000000;
  pvStack_60 = (vector<double,_std::allocator<double>_> *)0x403419999999999a;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40091eb851eb851f;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x400599999999999a;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_90,__l,(allocator_type *)&local_50);
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT35(local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                               super__Vector_impl_data._M_start._5_3_,0x3131303131);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_78;
  std::vector<char,_std::allocator<char>_>::vector(&local_50,__l_00,(allocator_type *)&local_a8);
  uVar19 = (long)(local_90._8_8_ - local_90._0_8_) >> 3;
  uVar14 = 2;
  if (uVar19 < 2) {
    uVar14 = uVar19;
  }
  if (local_90._8_8_ == local_90._0_8_) {
    local_58 = 0.0;
  }
  else {
    local_58 = 0.0;
    lVar16 = 0;
    do {
      local_58 = local_58 + *(double *)(local_90._8_8_ + lVar16 + -8);
      lVar16 = lVar16 + -8;
    } while (-lVar16 != uVar14 * 8);
  }
  poVar8 = std::ostream::_M_insert<double>(local_58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar8 = std::ostream::_M_insert<double>(local_58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pcVar6 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = local_90._0_8_;
  pvVar17 = (vector<double,_std::allocator<double>_> *)local_90;
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pvVar17 = (vector<double,_std::allocator<double>_> *)(local_90 + 8);
  }
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_78;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&local_50;
  pvStack_60 = (vector<double,_std::allocator<double>_> *)local_90;
  while ((piVar4 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
         piVar3 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish != (pointer)pcVar6 ||
         (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)uVar5))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar8 = std::ostream::_M_insert<double>(*(pointer)((long)piVar4 + -8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    local_a9 = *(allocator_type *)piVar3;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_a9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    ranges::
    cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,std::allocator<double>>>>,ranges::ref_view<std::vector<char,std::allocator<char>>>>
    ::cursor<false>::next_<2ul>((cursor<false> *)&local_a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar7 = (int)((ulong)(local_90._8_8_ - local_90._0_8_) >> 3) - 1;
  if (-1 < (int)uVar7) {
    uVar14 = (ulong)uVar7;
    paVar9 = (allocator_type *)
             local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar12 = (allocator_type *)
              local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      local_38 = uVar14;
      if (paVar12 + -1 != paVar9) {
        local_58 = *(pointer)(local_90._0_8_ + uVar14 * 8);
        paVar22 = (allocator_type *)0x0;
        do {
          aVar1 = paVar9[(long)paVar22];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
          poVar8 = std::ostream::_M_insert<double>(local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
          local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT71(local_78.super__Vector_base<short,_std::allocator<short>_>.
                                        _M_impl.super__Vector_impl_data._M_start._1_7_,aVar1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_78,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          paVar22 = paVar22 + 1;
          paVar9 = (allocator_type *)
                   local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          paVar12 = (allocator_type *)
                    local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (paVar22 < (allocator_type *)
                           (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                           ~(ulong)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start));
      }
      uVar14 = local_38 - 1;
    } while (0 < (long)local_38);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_1000000010001;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT62(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish._2_6_,1);
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&local_a8;
  std::vector<short,_std::allocator<short>_>::vector(&local_78,__l_01,&local_a9);
  iVar18 = 0;
  if (local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    iVar15 = 1;
    pvVar13 = (vector<char,_std::allocator<char>_> *)
              local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      iVar20 = *(short *)((long)&pvVar13[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage + 6) * iVar15;
      iVar15 = iVar15 * 2;
      pvVar13 = (vector<char,_std::allocator<char>_> *)
                ((long)&pvVar13[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6);
      iVar18 = iVar18 + iVar20;
    } while (pvVar13 !=
             (vector<char,_std::allocator<char>_> *)
             local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar7 = (int)((ulong)((long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 1) - 1;
  if ((int)uVar7 < 0) {
    iVar18 = 0;
  }
  else {
    uVar14 = (ulong)uVar7;
    iVar18 = 0;
    iVar15 = 1;
    do {
      iVar18 = iVar18 + *(short *)((long)&(((_Vector_base<char,_std::allocator<char>_> *)
                                           local_78.
                                           super__Vector_base<short,_std::allocator<short>_>._M_impl
                                           .super__Vector_impl_data._M_start)->_M_impl).
                                          super__Vector_impl_data._M_start + uVar14 * 2) * iVar15;
      iVar15 = iVar15 * 2;
      bVar23 = uVar14 != 0;
      uVar14 = uVar14 - 1;
    } while (bVar23);
  }
  plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  if ((vector<char,_std::allocator<char>_> *)
      local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (vector<char,_std::allocator<char>_> *)0x0) {
    operator_delete(local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  ranges::sort_fn::
  operator()<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::less,_ranges::identity>
            ((sort_fn *)&ranges::sort,local_90._0_8_,local_90._8_8_);
  for (pdVar21 = (pointer)local_90._0_8_; pdVar21 != (pointer)local_90._8_8_; pdVar21 = pdVar21 + 1)
  {
    poVar8 = std::ostream::_M_insert<double>(*pdVar21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1400000005;
  pvStack_60 = (vector<double,_std::allocator<double>_> *)0xa00000005;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xa0000000a;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x500000005;
  __l_02._M_len = 8;
  __l_02._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_02,(allocator_type *)&local_a9);
  _Var11 = ranges::unique_fn::
           operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::equal_to,_ranges::identity>
                     ((unique_fn *)&ranges::unique,
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  piVar2 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (_Var11._M_current !=
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)_Var11;
  }
  for (; piVar2 != _Var11._M_current; piVar2 = piVar2 + 1) {
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((allocator_type *)
      local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (allocator_type *)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_90._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._0_8_,(long)local_80 - local_90._0_8_);
  }
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto horizontal_line = [] { std::cout << "------" << std::endl; };
    auto new_line = [] { std::cout << std::endl; };

    auto v1 = vector<double>{3.14, 2.7, 10.5, 20.1};
    auto v2 = vector<char>{'1', '1', '0', '1', '1'};

    { // example #1: accumulate
        // below is a single for loop implementation summing things up
        auto sum1 = accumulate(v1 | views::reverse | views::take(2), 0.0);
        std::cout << sum1 << std::endl;

        horizontal_line();

        // this is the old-school way of writing it
        auto sum2 = 0.0;
        for(size_t i=v1.size()-1; i>=v1.size()-1-2; --i)
            sum2 += v1[i];
        std::cout << sum1 << std::endl;
    }
    new_line();

    { // example #2: nested-for-loop implementation with ranges
        // below is a nested-for-loop equivalent of going over v1 and v2.
        // nesting is actually equivalent to taking cartesian_product in mathematics
        for(auto [a, b] : views::cartesian_product(v1 | views::reverse, v2))
            std::cout << "[" << a << ", " << b << "]" << std::endl;

        horizontal_line();

        // this is the old-school nested for loop version! very prone to bugs.
        for(int i=v1.size()-1; i>=0; --i)
        {
            auto a = v1[i];
            for(size_t j=0; j<v2.size()-1; ++j)
            {
                auto b = v2[j];
                std::cout << "[" << a << ", " << b << "]" << std::endl;
            }
        }
    }
    new_line();

    { // example #3: inner-product (dot-product) -> single for-loop coupled with some other action

        // this is a generator that returns 1, k^1, k^2, k^3, k^4, ... respectively for each call
        auto powers_of_k = [](auto k) {
            return [i=1, k]() mutable { return (i*=k)/k; };
        };

        // make it a ranges-library compatible generator that generate 1, 2, 4, 8, 16, ...
        auto multiples_of_2 = views::generate(powers_of_k(2));

        auto v = vector<short>{1, 1, 0, 1, 1}; // base 10 repr. of binary number: 1*1 + 2*1 + 4*0 + 8*1 + 16*1

        auto result = inner_product(v | views::reverse, multiples_of_2, 0);
        std::cout << result << std::endl;

        horizontal_line();

        // this is the old-school version! very prone to bugs.
        auto sum = 0;
        auto k = 1;
        for(int i=v.size()-1; i>=0; --i)
        {
            sum += k * v[i];
            k *= 2;
        }
        std::cout << sum << std::endl;
    }
    new_line();

    // you can easily sort things with ranges library
    {
        v1 |= actions::sort;
        for(auto a : v1)
            std::cout << a << std::endl;
    }
    new_line();

    // you can easily get non-repeating (unique) elements with ranges library
    {
        auto v = vector<int>{10, 10, 5, 5, 5, 20, 5, 10};
        v |= actions::unique; // produces 10, 5, 20, 5, 10
        for(auto a : v)
            std::cout << a << std::endl;
    }
    return 0;
}